

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int32_t zng_deflate(zng_stream *strm,int32_t flush)

{
  uint8_t uVar1;
  uint uVar2;
  int32_t iVar3;
  uint8_t *puVar4;
  bool bVar5;
  int iVar6;
  uint32_t uVar7;
  block_state bVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  int iVar13;
  int iVar14;
  int in_ESI;
  zng_stream *in_RDI;
  block_state bstate;
  uchar val_1;
  uint32_t beg_2;
  uchar val;
  uint32_t beg_1;
  uint32_t copy;
  uint32_t left;
  uint32_t beg;
  uint level_flags;
  uint header;
  deflate_state *s;
  int32_t old_flush;
  undefined4 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9c;
  uint16_t in_stack_ffffffffffffff9e;
  block_state in_stack_ffffffffffffffa0;
  block_state in_stack_ffffffffffffffa4;
  uchar local_54;
  undefined3 uVar15;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint local_40;
  int in_stack_ffffffffffffffc4;
  uint32_t in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint local_30;
  uint local_2c;
  internal_state *piVar16;
  int32_t local_4;
  
  iVar6 = deflateStateCheck(in_RDI);
  if (((iVar6 == 0) && (in_ESI < 6)) && (-1 < in_ESI)) {
    piVar16 = in_RDI->state;
    if (((in_RDI->next_out == (uint8_t *)0x0) ||
        ((in_RDI->avail_in != 0 && (in_RDI->next_in == (uint8_t *)0x0)))) ||
       ((piVar16->status == 3 && (in_ESI != 4)))) {
      in_RDI->msg = "stream error";
      local_4 = -2;
    }
    else if (in_RDI->avail_out == 0) {
      in_RDI->msg = "buffer error";
      local_4 = -5;
    }
    else {
      iVar6 = piVar16->last_flush;
      piVar16->last_flush = in_ESI;
      if (piVar16->pending == 0) {
        if (in_RDI->avail_in == 0) {
          iVar13 = 0;
          if (4 < in_ESI) {
            iVar13 = 9;
          }
          iVar14 = 0;
          if (4 < iVar6) {
            iVar14 = 9;
          }
          if ((in_ESI * 2 - iVar13 <= iVar6 * 2 - iVar14) && (in_ESI != 4)) {
            in_RDI->msg = "buffer error";
            return -5;
          }
        }
      }
      else {
        zng_flush_pending((zng_stream *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        if (in_RDI->avail_out == 0) {
          piVar16->last_flush = -1;
          return 0;
        }
      }
      if ((piVar16->status == 3) && (in_RDI->avail_in != 0)) {
        in_RDI->msg = "buffer error";
        local_4 = -5;
      }
      else {
        if ((piVar16->status == 1) && (piVar16->wrap == 0)) {
          piVar16->status = 2;
        }
        if (piVar16->status == 1) {
          put_short_msb((deflate_state *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9e);
          if (piVar16->strstart != 0) {
            put_uint32_msb((deflate_state *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c));
          }
          in_RDI->adler = 1;
          piVar16->status = 2;
          zng_flush_pending((zng_stream *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          if (piVar16->pending != 0) {
            piVar16->last_flush = -1;
            return 0;
          }
        }
        if (piVar16->status == 4) {
          (*functable.crc32_fold_reset)(&piVar16->crc_fold);
          uVar2 = piVar16->pending;
          piVar16->pending = uVar2 + 1;
          piVar16->pending_buf[uVar2] = '\x1f';
          uVar2 = piVar16->pending;
          piVar16->pending = uVar2 + 1;
          piVar16->pending_buf[uVar2] = 0x8b;
          uVar2 = piVar16->pending;
          piVar16->pending = uVar2 + 1;
          piVar16->pending_buf[uVar2] = '\b';
          if (piVar16->gzhead == (zng_gz_headerp)0x0) {
            put_uint32((deflate_state *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c));
            uVar2 = piVar16->pending;
            piVar16->pending = uVar2 + 1;
            piVar16->pending_buf[uVar2] = '\0';
            if (piVar16->level == 9) {
              in_stack_ffffffffffffffb4 = 2;
            }
            else {
              uVar15 = (undefined3)in_stack_ffffffffffffffb0;
              in_stack_ffffffffffffffb0 = CONCAT13(1,uVar15);
              if (piVar16->strategy < 2) {
                in_stack_ffffffffffffffb0 = CONCAT13(piVar16->level < 2,uVar15);
              }
              in_stack_ffffffffffffffb4 = 0;
              if ((char)((uint)in_stack_ffffffffffffffb0 >> 0x18) != '\0') {
                in_stack_ffffffffffffffb4 = 4;
              }
            }
            uVar2 = piVar16->pending;
            piVar16->pending = uVar2 + 1;
            piVar16->pending_buf[uVar2] = (uchar)in_stack_ffffffffffffffb4;
            uVar2 = piVar16->pending;
            piVar16->pending = uVar2 + 1;
            piVar16->pending_buf[uVar2] = '\x03';
            piVar16->status = 2;
            zng_flush_pending((zng_stream *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
            if (piVar16->pending != 0) {
              piVar16->last_flush = -1;
              return 0;
            }
          }
          else {
            iVar13 = piVar16->gzhead->text;
            cVar9 = '\0';
            if (piVar16->gzhead->hcrc != 0) {
              cVar9 = '\x02';
            }
            cVar10 = '\x04';
            if (piVar16->gzhead->extra == (uint8_t *)0x0) {
              cVar10 = '\0';
            }
            cVar11 = '\b';
            if (piVar16->gzhead->name == (uint8_t *)0x0) {
              cVar11 = '\0';
            }
            cVar12 = '\x10';
            if (piVar16->gzhead->comment == (uint8_t *)0x0) {
              cVar12 = '\0';
            }
            uVar2 = piVar16->pending;
            piVar16->pending = uVar2 + 1;
            piVar16->pending_buf[uVar2] = (iVar13 != 0) + cVar9 + cVar10 + cVar11 + cVar12;
            put_uint32((deflate_state *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c));
            if (piVar16->level == 9) {
              local_54 = '\x02';
            }
            else {
              bVar5 = true;
              if (piVar16->strategy < 2) {
                bVar5 = piVar16->level < 2;
              }
              local_54 = '\0';
              if (bVar5) {
                local_54 = '\x04';
              }
            }
            uVar2 = piVar16->pending;
            piVar16->pending = uVar2 + 1;
            piVar16->pending_buf[uVar2] = local_54;
            iVar3 = piVar16->gzhead->os;
            uVar2 = piVar16->pending;
            piVar16->pending = uVar2 + 1;
            piVar16->pending_buf[uVar2] = (uchar)iVar3;
            if (piVar16->gzhead->extra != (uint8_t *)0x0) {
              put_short((deflate_state *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9e);
            }
            if (piVar16->gzhead->hcrc != 0) {
              uVar7 = zng_crc32(in_stack_ffffffffffffffa4,
                                (uchar *)CONCAT26(in_stack_ffffffffffffff9e,
                                                  CONCAT24(in_stack_ffffffffffffff9c,
                                                           in_stack_ffffffffffffff98)),0);
              in_RDI->adler = uVar7;
            }
            piVar16->gzindex = 0;
            piVar16->status = 5;
          }
        }
        if (piVar16->status == 5) {
          if (piVar16->gzhead->extra != (uint8_t *)0x0) {
            local_2c = piVar16->pending;
            for (local_30 = (piVar16->gzhead->extra_len & 0xffff) - piVar16->gzindex;
                piVar16->pending_buf_size < piVar16->pending + local_30;
                local_30 = local_30 - in_stack_ffffffffffffffcc) {
              in_stack_ffffffffffffffcc = piVar16->pending_buf_size - piVar16->pending;
              memcpy(piVar16->pending_buf + piVar16->pending,
                     piVar16->gzhead->extra + piVar16->gzindex,(ulong)in_stack_ffffffffffffffcc);
              piVar16->pending = piVar16->pending_buf_size;
              if ((piVar16->gzhead->hcrc != 0) && (local_2c < piVar16->pending)) {
                uVar7 = zng_crc32(in_stack_ffffffffffffffa4,
                                  (uchar *)CONCAT26(in_stack_ffffffffffffff9e,
                                                    CONCAT24(in_stack_ffffffffffffff9c,
                                                             in_stack_ffffffffffffff98)),0);
                in_RDI->adler = uVar7;
              }
              piVar16->gzindex = in_stack_ffffffffffffffcc + piVar16->gzindex;
              zng_flush_pending((zng_stream *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
              if (piVar16->pending != 0) {
                piVar16->last_flush = -1;
                return 0;
              }
              local_2c = 0;
            }
            memcpy(piVar16->pending_buf + piVar16->pending,piVar16->gzhead->extra + piVar16->gzindex
                   ,(ulong)local_30);
            piVar16->pending = local_30 + piVar16->pending;
            if ((piVar16->gzhead->hcrc != 0) && (local_2c < piVar16->pending)) {
              uVar7 = zng_crc32(in_stack_ffffffffffffffa4,
                                (uchar *)CONCAT26(in_stack_ffffffffffffff9e,
                                                  CONCAT24(in_stack_ffffffffffffff9c,
                                                           in_stack_ffffffffffffff98)),0);
              in_RDI->adler = uVar7;
            }
            piVar16->gzindex = 0;
          }
          piVar16->status = 6;
        }
        if (piVar16->status == 6) {
          if (piVar16->gzhead->name != (uint8_t *)0x0) {
            in_stack_ffffffffffffffc8 = piVar16->pending;
            do {
              if (piVar16->pending == piVar16->pending_buf_size) {
                if ((piVar16->gzhead->hcrc != 0) && (in_stack_ffffffffffffffc8 < piVar16->pending))
                {
                  uVar7 = zng_crc32(in_stack_ffffffffffffffa4,
                                    (uchar *)CONCAT26(in_stack_ffffffffffffff9e,
                                                      CONCAT24(in_stack_ffffffffffffff9c,
                                                               in_stack_ffffffffffffff98)),0);
                  in_RDI->adler = uVar7;
                }
                zng_flush_pending((zng_stream *)
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
                if (piVar16->pending != 0) {
                  piVar16->last_flush = -1;
                  return 0;
                }
                in_stack_ffffffffffffffc8 = 0;
              }
              puVar4 = piVar16->gzhead->name;
              uVar2 = piVar16->gzindex;
              piVar16->gzindex = uVar2 + 1;
              uVar1 = puVar4[uVar2];
              in_stack_ffffffffffffffc4 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffc4);
              uVar2 = piVar16->pending;
              piVar16->pending = uVar2 + 1;
              piVar16->pending_buf[uVar2] = uVar1;
            } while (uVar1 != '\0');
            if ((piVar16->gzhead->hcrc != 0) && (in_stack_ffffffffffffffc8 < piVar16->pending)) {
              uVar7 = zng_crc32(in_stack_ffffffffffffffa4,
                                (uchar *)CONCAT26(in_stack_ffffffffffffff9e,
                                                  CONCAT24(in_stack_ffffffffffffff9c,
                                                           in_stack_ffffffffffffff98)),0);
              in_RDI->adler = uVar7;
            }
            piVar16->gzindex = 0;
          }
          piVar16->status = 7;
        }
        if (piVar16->status == 7) {
          if (piVar16->gzhead->comment != (uint8_t *)0x0) {
            local_40 = piVar16->pending;
            do {
              if (piVar16->pending == piVar16->pending_buf_size) {
                if ((piVar16->gzhead->hcrc != 0) && (local_40 < piVar16->pending)) {
                  uVar7 = zng_crc32(in_stack_ffffffffffffffa4,
                                    (uchar *)CONCAT26(in_stack_ffffffffffffff9e,
                                                      CONCAT24(in_stack_ffffffffffffff9c,
                                                               in_stack_ffffffffffffff98)),0);
                  in_RDI->adler = uVar7;
                }
                zng_flush_pending((zng_stream *)
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
                if (piVar16->pending != 0) {
                  piVar16->last_flush = -1;
                  return 0;
                }
                local_40 = 0;
              }
              puVar4 = piVar16->gzhead->comment;
              uVar2 = piVar16->gzindex;
              piVar16->gzindex = uVar2 + 1;
              uVar1 = puVar4[uVar2];
              uVar2 = piVar16->pending;
              piVar16->pending = uVar2 + 1;
              piVar16->pending_buf[uVar2] = uVar1;
            } while (uVar1 != '\0');
            if ((piVar16->gzhead->hcrc != 0) && (local_40 < piVar16->pending)) {
              uVar7 = zng_crc32(in_stack_ffffffffffffffa4,
                                (uchar *)CONCAT26(in_stack_ffffffffffffff9e,
                                                  CONCAT24(in_stack_ffffffffffffff9c,
                                                           in_stack_ffffffffffffff98)),0);
              in_RDI->adler = uVar7;
            }
          }
          piVar16->status = 8;
        }
        if (piVar16->status == 8) {
          if (piVar16->gzhead->hcrc != 0) {
            if ((piVar16->pending_buf_size < piVar16->pending + 2) &&
               (zng_flush_pending((zng_stream *)
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)),
               piVar16->pending != 0)) {
              piVar16->last_flush = -1;
              return 0;
            }
            put_short((deflate_state *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                      ,in_stack_ffffffffffffff9e);
            (*functable.crc32_fold_reset)(&piVar16->crc_fold);
          }
          piVar16->status = 2;
          zng_flush_pending((zng_stream *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          if (piVar16->pending != 0) {
            piVar16->last_flush = -1;
            return 0;
          }
        }
        if (((in_RDI->avail_in != 0) || (piVar16->lookahead != 0)) ||
           ((in_ESI != 0 && (piVar16->status != 3)))) {
          iVar13 = (int)((ulong)piVar16 >> 0x20);
          if (piVar16->level == 0) {
            in_stack_ffffffffffffffa4 =
                 deflate_stored((deflate_state *)CONCAT44(in_ESI,iVar6),iVar13);
          }
          else if (piVar16->strategy == 2) {
            in_stack_ffffffffffffffa0 =
                 deflate_huff((deflate_state *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                              in_stack_ffffffffffffffc4);
            in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa0;
          }
          else {
            if (piVar16->strategy == 3) {
              bVar8 = deflate_rle((deflate_state *)CONCAT44(in_ESI,iVar6),iVar13);
              in_stack_ffffffffffffff9c = (undefined2)bVar8;
              in_stack_ffffffffffffff9e = (uint16_t)(bVar8 >> 0x10);
            }
            else {
              bVar8 = (*configuration_table[piVar16->level].func)(piVar16,in_ESI);
              in_stack_ffffffffffffff9c = (undefined2)bVar8;
              in_stack_ffffffffffffff9e = (uint16_t)(bVar8 >> 0x10);
            }
            in_stack_ffffffffffffffa0 =
                 CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c);
            in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa0;
          }
          if ((in_stack_ffffffffffffffa4 == finish_started) ||
             (in_stack_ffffffffffffffa4 == finish_done)) {
            piVar16->status = 3;
          }
          if ((in_stack_ffffffffffffffa4 == need_more) ||
             (in_stack_ffffffffffffffa4 == finish_started)) {
            if (in_RDI->avail_out == 0) {
              piVar16->last_flush = -1;
            }
            return 0;
          }
          if (in_stack_ffffffffffffffa4 == block_done) {
            if (in_ESI == 1) {
              zng_tr_align((deflate_state *)0x1085bf);
            }
            else if (((in_ESI != 5) &&
                     (zng_tr_stored_block((deflate_state *)CONCAT44(1,in_stack_ffffffffffffffa0),
                                          (char *)CONCAT26(in_stack_ffffffffffffff9e,
                                                           CONCAT24(in_stack_ffffffffffffff9c,
                                                                    in_stack_ffffffffffffff98)),0,
                                          0x1085da), in_ESI == 3)) &&
                    (memset(piVar16->head,0,0x20000), piVar16->lookahead == 0)) {
              piVar16->strstart = 0;
              piVar16->block_start = 0;
              piVar16->insert = 0;
            }
            zng_flush_pending((zng_stream *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
            if (in_RDI->avail_out == 0) {
              piVar16->last_flush = -1;
              return 0;
            }
          }
        }
        if (in_ESI == 4) {
          if (piVar16->wrap == 2) {
            uVar7 = (*functable.crc32_fold_final)(&piVar16->crc_fold);
            in_RDI->adler = uVar7;
            put_uint32((deflate_state *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c));
            put_uint32((deflate_state *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c));
          }
          else if (piVar16->wrap == 1) {
            put_uint32_msb((deflate_state *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c));
          }
          zng_flush_pending((zng_stream *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          if (0 < piVar16->wrap) {
            piVar16->wrap = -piVar16->wrap;
          }
          if (piVar16->pending == 0) {
            local_4 = 1;
          }
          else {
            local_4 = 0;
          }
        }
        else {
          local_4 = 0;
        }
      }
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflate)(PREFIX3(stream) *strm, int32_t flush) {
    int32_t old_flush; /* value of flush param for previous deflate call */
    deflate_state *s;

    if (deflateStateCheck(strm) || flush > Z_BLOCK || flush < 0)
        return Z_STREAM_ERROR;
    s = strm->state;

    if (strm->next_out == NULL || (strm->avail_in != 0 && strm->next_in == NULL)
        || (s->status == FINISH_STATE && flush != Z_FINISH)) {
        ERR_RETURN(strm, Z_STREAM_ERROR);
    }
    if (strm->avail_out == 0) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    old_flush = s->last_flush;
    s->last_flush = flush;

    /* Flush as much pending output as possible */
    if (s->pending != 0) {
        PREFIX(flush_pending)(strm);
        if (strm->avail_out == 0) {
            /* Since avail_out is 0, deflate will be called again with
             * more output space, but possibly with both pending and
             * avail_in equal to zero. There won't be anything to do,
             * but this is not an error situation so make sure we
             * return OK instead of BUF_ERROR at next call of deflate:
             */
            s->last_flush = -1;
            return Z_OK;
        }

        /* Make sure there is something to do and avoid duplicate consecutive
         * flushes. For repeated and useless calls with Z_FINISH, we keep
         * returning Z_STREAM_END instead of Z_BUF_ERROR.
         */
    } else if (strm->avail_in == 0 && RANK(flush) <= RANK(old_flush) && flush != Z_FINISH) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* User must not provide more input after the first FINISH: */
    if (s->status == FINISH_STATE && strm->avail_in != 0)   {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* Write the header */
    if (s->status == INIT_STATE && s->wrap == 0)
        s->status = BUSY_STATE;
    if (s->status == INIT_STATE) {
        /* zlib header */
        unsigned int header = (Z_DEFLATED + ((s->w_bits-8)<<4)) << 8;
        unsigned int level_flags;

        if (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2)
            level_flags = 0;
        else if (s->level < 6)
            level_flags = 1;
        else if (s->level == 6)
            level_flags = 2;
        else
            level_flags = 3;
        header |= (level_flags << 6);
        if (s->strstart != 0)
            header |= PRESET_DICT;
        header += 31 - (header % 31);

        put_short_msb(s, (uint16_t)header);

        /* Save the adler32 of the preset dictionary: */
        if (s->strstart != 0)
            put_uint32_msb(s, strm->adler);
        strm->adler = ADLER32_INITIAL_VALUE;
        s->status = BUSY_STATE;

        /* Compression must start with an empty pending buffer */
        PREFIX(flush_pending)(strm);
        if (s->pending != 0) {
            s->last_flush = -1;
            return Z_OK;
        }
    }
#ifdef GZIP
    if (s->status == GZIP_STATE) {
        /* gzip header */
        FUNCTABLE_CALL(crc32_fold_reset)(&s->crc_fold);
        put_byte(s, 31);
        put_byte(s, 139);
        put_byte(s, 8);
        if (s->gzhead == NULL) {
            put_uint32(s, 0);
            put_byte(s, 0);
            put_byte(s, s->level == 9 ? 2 :
                     (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ? 4 : 0));
            put_byte(s, OS_CODE);
            s->status = BUSY_STATE;

            /* Compression must start with an empty pending buffer */
            PREFIX(flush_pending)(strm);
            if (s->pending != 0) {
                s->last_flush = -1;
                return Z_OK;
            }
        } else {
            put_byte(s, (s->gzhead->text ? 1 : 0) +
                     (s->gzhead->hcrc ? 2 : 0) +
                     (s->gzhead->extra == NULL ? 0 : 4) +
                     (s->gzhead->name == NULL ? 0 : 8) +
                     (s->gzhead->comment == NULL ? 0 : 16)
                     );
            put_uint32(s, s->gzhead->time);
            put_byte(s, s->level == 9 ? 2 : (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ? 4 : 0));
            put_byte(s, s->gzhead->os & 0xff);
            if (s->gzhead->extra != NULL)
                put_short(s, (uint16_t)s->gzhead->extra_len);
            if (s->gzhead->hcrc)
                strm->adler = PREFIX(crc32)(strm->adler, s->pending_buf, s->pending);
            s->gzindex = 0;
            s->status = EXTRA_STATE;
        }
    }
    if (s->status == EXTRA_STATE) {
        if (s->gzhead->extra != NULL) {
            uint32_t beg = s->pending;   /* start of bytes to update crc */
            uint32_t left = (s->gzhead->extra_len & 0xffff) - s->gzindex;

            while (s->pending + left > s->pending_buf_size) {
                uint32_t copy = s->pending_buf_size - s->pending;
                memcpy(s->pending_buf + s->pending, s->gzhead->extra + s->gzindex, copy);
                s->pending = s->pending_buf_size;
                HCRC_UPDATE(beg);
                s->gzindex += copy;
                PREFIX(flush_pending)(strm);
                if (s->pending != 0) {
                    s->last_flush = -1;
                    return Z_OK;
                }
                beg = 0;
                left -= copy;
            }
            memcpy(s->pending_buf + s->pending, s->gzhead->extra + s->gzindex, left);
            s->pending += left;
            HCRC_UPDATE(beg);
            s->gzindex = 0;
        }
        s->status = NAME_STATE;
    }
    if (s->status == NAME_STATE) {
        if (s->gzhead->name != NULL) {
            uint32_t beg = s->pending;   /* start of bytes to update crc */
            unsigned char val;

            do {
                if (s->pending == s->pending_buf_size) {
                    HCRC_UPDATE(beg);
                    PREFIX(flush_pending)(strm);
                    if (s->pending != 0) {
                        s->last_flush = -1;
                        return Z_OK;
                    }
                    beg = 0;
                }
                val = s->gzhead->name[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            HCRC_UPDATE(beg);
            s->gzindex = 0;
        }
        s->status = COMMENT_STATE;
    }
    if (s->status == COMMENT_STATE) {
        if (s->gzhead->comment != NULL) {
            uint32_t beg = s->pending;  /* start of bytes to update crc */
            unsigned char val;

            do {
                if (s->pending == s->pending_buf_size) {
                    HCRC_UPDATE(beg);
                    PREFIX(flush_pending)(strm);
                    if (s->pending != 0) {
                        s->last_flush = -1;
                        return Z_OK;
                    }
                    beg = 0;
                }
                val = s->gzhead->comment[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            HCRC_UPDATE(beg);
        }
        s->status = HCRC_STATE;
    }
    if (s->status == HCRC_STATE) {
        if (s->gzhead->hcrc) {
            if (s->pending + 2 > s->pending_buf_size) {
                PREFIX(flush_pending)(strm);
                if (s->pending != 0) {
                    s->last_flush = -1;
                    return Z_OK;
                }
            }
            put_short(s, (uint16_t)strm->adler);
            FUNCTABLE_CALL(crc32_fold_reset)(&s->crc_fold);
        }
        s->status = BUSY_STATE;

        /* Compression must start with an empty pending buffer */
        PREFIX(flush_pending)(strm);
        if (s->pending != 0) {
            s->last_flush = -1;
            return Z_OK;
        }
    }
#endif

    /* Start a new block or continue the current one.
     */
    if (strm->avail_in != 0 || s->lookahead != 0 || (flush != Z_NO_FLUSH && s->status != FINISH_STATE)) {
        block_state bstate;

        bstate = DEFLATE_HOOK(strm, flush, &bstate) ? bstate :  /* hook for IBM Z DFLTCC */
                 s->level == 0 ? deflate_stored(s, flush) :
                 s->strategy == Z_HUFFMAN_ONLY ? deflate_huff(s, flush) :
                 s->strategy == Z_RLE ? deflate_rle(s, flush) :
                 (*(configuration_table[s->level].func))(s, flush);

        if (bstate == finish_started || bstate == finish_done) {
            s->status = FINISH_STATE;
        }
        if (bstate == need_more || bstate == finish_started) {
            if (strm->avail_out == 0) {
                s->last_flush = -1; /* avoid BUF_ERROR next call, see above */
            }
            return Z_OK;
            /* If flush != Z_NO_FLUSH && avail_out == 0, the next call
             * of deflate should use the same flush parameter to make sure
             * that the flush is complete. So we don't have to output an
             * empty block here, this will be done at next call. This also
             * ensures that for a very small output buffer, we emit at most
             * one empty block.
             */
        }
        if (bstate == block_done) {
            if (flush == Z_PARTIAL_FLUSH) {
                zng_tr_align(s);
            } else if (flush != Z_BLOCK) { /* FULL_FLUSH or SYNC_FLUSH */
                zng_tr_stored_block(s, (char*)0, 0L, 0);
                /* For a full flush, this empty block will be recognized
                 * as a special marker by inflate_sync().
                 */
                if (flush == Z_FULL_FLUSH) {
                    CLEAR_HASH(s);             /* forget history */
                    if (s->lookahead == 0) {
                        s->strstart = 0;
                        s->block_start = 0;
                        s->insert = 0;
                    }
                }
            }
            PREFIX(flush_pending)(strm);
            if (strm->avail_out == 0) {
                s->last_flush = -1; /* avoid BUF_ERROR at next call, see above */
                return Z_OK;
            }
        }
    }

    if (flush != Z_FINISH)
        return Z_OK;

    /* Write the trailer */
#ifdef GZIP
    if (s->wrap == 2) {
        strm->adler = FUNCTABLE_CALL(crc32_fold_final)(&s->crc_fold);

        put_uint32(s, strm->adler);
        put_uint32(s, (uint32_t)strm->total_in);
    } else
#endif
    {
        if (s->wrap == 1)
            put_uint32_msb(s, strm->adler);
    }
    PREFIX(flush_pending)(strm);
    /* If avail_out is zero, the application will call deflate again
     * to flush the rest.
     */
    if (s->wrap > 0)
        s->wrap = -s->wrap; /* write the trailer only once! */
    if (s->pending == 0) {
        Assert(s->bi_valid == 0, "bi_buf not flushed");
        return Z_STREAM_END;
    }
    return Z_OK;
}